

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# srtStreamReader.cpp
# Opt level: O0

bool __thiscall
SRTStreamReader::detectSrcFormat(SRTStreamReader *this,uint8_t *dataStart,size_t len,int *prefixLen)

{
  Boolean BVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  ostream *this_00;
  int *prefixLen_local;
  size_t len_local;
  uint8_t *dataStart_local;
  SRTStreamReader *this_local;
  
  *prefixLen = 0;
  if (len < 4) {
    this_local._7_1_ = false;
  }
  else {
    if ((((*dataStart == 0xef) && (dataStart[1] == 0xbb)) && (dataStart[2] == 0xbf)) ||
       (BVar1 = convertUTF::isLegalUTF8String(dataStart,len), BVar1)) {
      this->m_charSize = 1;
      this->m_srcFormat = sfUTF8;
      *prefixLen = 3;
    }
    else if (((*dataStart == '\0') && (dataStart[1] == '\0')) &&
            ((dataStart[2] == 0xfe && (dataStart[3] == 0xff)))) {
      this->m_srcFormat = sfUTF32be;
      this->m_charSize = 4;
      *prefixLen = 4;
      this->m_splitterOfs = 3;
      uVar3 = my_ntohl(10);
      this->m_long_N = uVar3;
      uVar3 = my_ntohl(0xd);
      this->m_long_R = uVar3;
    }
    else if (((*dataStart == 0xff) && (dataStart[1] == 0xfe)) &&
            ((dataStart[2] == '\0' && (dataStart[3] == '\0')))) {
      this->m_srcFormat = sfUTF32le;
      this->m_charSize = 4;
      *prefixLen = 4;
      uVar3 = my_ntohl(0xa000000);
      this->m_long_N = uVar3;
      uVar3 = my_ntohl(0xd000000);
      this->m_long_R = uVar3;
    }
    else if ((*dataStart == 0xfe) && (dataStart[1] == 0xff)) {
      this->m_srcFormat = sfUTF16be;
      this->m_charSize = 2;
      *prefixLen = 2;
      this->m_splitterOfs = 1;
      uVar2 = my_ntohs(10);
      this->m_short_N = uVar2;
      uVar2 = my_ntohs(0xd);
      this->m_short_R = uVar2;
    }
    else if ((*dataStart == 0xff) && (dataStart[1] == 0xfe)) {
      this->m_srcFormat = sfUTF16le;
      this->m_charSize = 2;
      *prefixLen = 2;
      uVar2 = my_ntohs(0xa00);
      this->m_short_N = uVar2;
      uVar2 = my_ntohs(0xd00);
      this->m_short_R = uVar2;
    }
    else {
      this_00 = std::operator<<((ostream *)&std::cout,
                                "Failed to auto-detect SRT encoding : falling back to UTF-8");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      sLastMsg = true;
      this->m_srcFormat = sfUTF8;
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool SRTStreamReader::detectSrcFormat(const uint8_t* dataStart, const size_t len, int& prefixLen)
{
    prefixLen = 0;
    if (len < 4)
        return false;
    // detect UTF-8/UTF-16/UTF-32 format
    if ((dataStart[0] == 0xEF && dataStart[1] == 0xBB && dataStart[2] == 0xBF) ||
        convertUTF::isLegalUTF8String(dataStart, len))
    {
        m_charSize = 1;
        m_srcFormat = UtfConverter::SourceFormat::sfUTF8;
        prefixLen = 3;
    }
    else if (dataStart[0] == 0 && dataStart[1] == 0 && dataStart[2] == 0xFE && dataStart[3] == 0xFF)
    {
        m_srcFormat = UtfConverter::SourceFormat::sfUTF32be;
        m_charSize = 4;
        prefixLen = 4;
        m_splitterOfs = 3;
        m_long_N = my_htonl(0x0000000a);
        m_long_R = my_htonl(0x0000000d);
    }
    else if (dataStart[0] == 0xFF && dataStart[1] == 0xFE && dataStart[2] == 0 && dataStart[3] == 0)
    {
        m_srcFormat = UtfConverter::SourceFormat::sfUTF32le;
        m_charSize = 4;
        prefixLen = 4;
        m_long_N = my_htonl(0x0a000000);
        m_long_R = my_htonl(0x0d000000);
    }
    else if (dataStart[0] == 0xFE && dataStart[1] == 0xFF)
    {
        m_srcFormat = UtfConverter::SourceFormat::sfUTF16be;
        m_charSize = 2;
        prefixLen = 2;
        m_splitterOfs = 1;
        m_short_N = my_htons(0x000a);
        m_short_R = my_htons(0x000d);
    }
    else if (dataStart[0] == 0xFF && dataStart[1] == 0xFE)
    {
        m_srcFormat = UtfConverter::SourceFormat::sfUTF16le;
        m_charSize = 2;
        prefixLen = 2;
        m_short_N = my_htons(0x0a00);
        m_short_R = my_htons(0x0d00);
    }
    else
    {
#ifdef _WIN32
        LTRACE(LT_INFO, 2, "Failed to auto-detect SRT encoding : falling back to the active code page");
        m_srcFormat = UtfConverter::SourceFormat::sfANSI;  // default value for win32
#else
        LTRACE(LT_INFO, 2, "Failed to auto-detect SRT encoding : falling back to UTF-8");
        m_srcFormat = UtfConverter::SourceFormat::sfUTF8;
#endif
    }
    return true;
}